

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O1

unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true> __thiscall
duckdb::MultiFileReader::Create(MultiFileReader *this,TableFunction *table_function)

{
  _func_int **pp_Var1;
  _func_int **in_RAX;
  _func_int **pp_Var2;
  pointer pMVar3;
  pointer *__ptr_1;
  pointer *__ptr;
  _func_int **local_18;
  
  this->_vptr_MultiFileReader = (_func_int **)0x0;
  local_18 = in_RAX;
  if (table_function->get_multi_file_reader == (table_function_get_multi_file_reader_t)0x0) {
    pp_Var2 = (_func_int **)operator_new(0x28);
    *pp_Var2 = (_func_int *)0x0;
    pp_Var2[1] = (_func_int *)0x0;
    pp_Var2[2] = (_func_int *)0x0;
    pp_Var2[3] = (_func_int *)0x0;
    pp_Var2[4] = (_func_int *)0x0;
    *pp_Var2 = (_func_int *)&PTR__MultiFileReader_0249ee38;
    pp_Var2[1] = (_func_int *)(pp_Var2 + 3);
    pp_Var2[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var2 + 3) = 0;
    this->_vptr_MultiFileReader = pp_Var2;
  }
  else {
    (*table_function->get_multi_file_reader)((TableFunction *)&stack0xffffffffffffffe8);
    pp_Var1 = local_18;
    local_18 = (_func_int **)0x0;
    pp_Var2 = this->_vptr_MultiFileReader;
    this->_vptr_MultiFileReader = pp_Var1;
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 8))();
    }
    if (local_18 != (_func_int **)0x0) {
      (**(code **)(*local_18 + 8))();
    }
  }
  pMVar3 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                       *)this);
  ::std::__cxx11::string::_M_assign((string *)&pMVar3->function_name);
  return (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>)
         (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>)this;
}

Assistant:

unique_ptr<MultiFileReader> MultiFileReader::Create(const TableFunction &table_function) {
	unique_ptr<MultiFileReader> res;
	if (table_function.get_multi_file_reader) {
		res = table_function.get_multi_file_reader(table_function);
		res->function_name = table_function.name;
	} else {
		res = make_uniq<MultiFileReader>();
		res->function_name = table_function.name;
	}
	return res;
}